

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringManip_anagramDeletion.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  string b;
  string a;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  string local_68;
  string local_48;
  
  local_80 = 0;
  local_78 = 0;
  local_a0 = 0;
  local_98 = 0;
  local_a8 = &local_98;
  local_88 = &local_78;
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x48);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_88,cVar1);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x48);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_a8,cVar1);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_88,local_88 + local_80);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_a8,local_a8 + local_a0);
  iVar2 = makeAnagram(&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  return 0;
}

Assistant:

int main()
{
	string a,b;
	getline(cin,a);
	getline(cin,b);
	int result = makeAnagram(a,b);
	cout<<result<<endl;
	return 0;
}